

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManPoXSim(Gia_Man_t *p,int nFrames,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  ulong uVar6;
  int Entry;
  int iVar7;
  ulong uVar8;
  char *__format;
  int iVar9;
  int local_58;
  ulong local_48;
  
  local_58 = p->vCos->nSize - p->nRegs;
  p_00 = Vec_IntAlloc(local_58);
  Vec_IntFill(p_00,p->vCos->nSize - p->nRegs,nFrames);
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
  iVar7 = 0;
  while ((iVar7 < p->nRegs &&
         (pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar7), pGVar3 != (Gia_Obj_t *)0x0))) {
    *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffbfffffff | 0x40000000;
    iVar7 = iVar7 + 1;
  }
  Entry = 0;
  iVar7 = 0;
  if (0 < nFrames) {
    iVar7 = nFrames;
  }
  local_48 = 0x4000000000000000;
  do {
    uVar8 = (ulong)(uint)nFrames;
    if (Entry == iVar7) {
      if (fVerbose != 0) {
        if (local_58 == 0) {
LAB_00217b49:
          uVar8 = (ulong)(iVar7 + 1);
          __format = "Simulation converged after %d frames.\n";
        }
        else {
          __format = "Simulation terminated after %d frames.\n";
        }
        printf(__format,uVar8);
      }
      return p_00;
    }
    iVar9 = 0;
    while ((iVar9 < p->vCis->nSize - p->nRegs &&
           (pGVar3 = Gia_ManCi(p,iVar9), pGVar3 != (Gia_Obj_t *)0x0))) {
      *(ulong *)pGVar3 = *(ulong *)pGVar3 | 0x4000000040000000;
      iVar9 = iVar9 + 1;
    }
    iVar9 = 0;
    while ((iVar9 < p->nRegs &&
           (pGVar3 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar9), pGVar3 != (Gia_Obj_t *)0x0)))
    {
      pGVar4 = Gia_ObjRoToRi(p,pGVar3);
      iVar1 = Gia_ObjIsRo(p,pGVar3);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x3b3,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
      }
      if ((*(ulong *)pGVar4 & 0x4000000040000000) == 0) {
        __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x3b4,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar5 = *(ulong *)pGVar4 & 0x40000000;
      uVar8 = *(ulong *)pGVar3;
      *(ulong *)pGVar3 = uVar8 & 0xffffffffbfffffff | uVar5;
      *(ulong *)pGVar3 = uVar8 & 0xbfffffffbfffffff | uVar5 | *(ulong *)pGVar4 & 0x4000000000000000;
      iVar9 = iVar9 + 1;
    }
    iVar9 = 0;
    while ((iVar9 < p->nObjs && (pGVar3 = Gia_ManObj(p,iVar9), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar8 = *(ulong *)pGVar3;
      if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
        if (((undefined1  [12])pGVar3[-(uVar8 & 0x1fffffff)] & (undefined1  [12])0x4000000040000000)
            == (undefined1  [12])0x0) {
          __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x39c,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
        }
        uVar5 = *(ulong *)(pGVar3 + -(ulong)((uint)(uVar8 >> 0x20) & 0x1fffffff)) &
                0x4000000040000000;
        if (uVar5 == 0) {
          __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x39d,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
        }
        iVar1 = Gia_ObjTerSimGet0Fanin0(pGVar3);
        if (iVar1 == 0) {
          uVar6 = local_48;
          if ((uVar8 >> 0x3d & 1) == 0) {
            uVar6 = 0x40000000;
          }
          if (uVar5 == uVar6) goto LAB_00217916;
          iVar1 = Gia_ObjTerSimGet1Fanin0(pGVar3);
          uVar6 = 0x40000000;
          if ((uVar8 >> 0x3d & 1) == 0) {
            uVar6 = local_48;
          }
          if ((uVar5 == uVar6) && (iVar1 != 0)) {
            uVar8 = (uVar8 & 0xbfffffff3fffffff) + 0x4000000000000000;
          }
          else {
            uVar8 = uVar8 | 0x4000000040000000;
          }
        }
        else {
LAB_00217916:
          uVar8 = uVar8 & 0xbfffffff3fffffff | 0x40000000;
        }
        *(ulong *)pGVar3 = uVar8;
      }
      iVar9 = iVar9 + 1;
    }
    iVar9 = 0;
    while ((iVar9 < p->vCos->nSize && (pGVar3 = Gia_ManCo(p,iVar9), pGVar3 != (Gia_Obj_t *)0x0))) {
      uVar8 = *(ulong *)pGVar3;
      if ((-1 < (int)(uint)uVar8) || (uVar2 = (uint)uVar8 & 0x1fffffff, uVar2 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x3a7,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
      }
      if (((undefined1  [12])pGVar3[-(ulong)uVar2] & (undefined1  [12])0x4000000040000000) ==
          (undefined1  [12])0x0) {
        __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x3a8,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
      }
      iVar1 = Gia_ObjTerSimGet0Fanin0(pGVar3);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjTerSimGet1Fanin0(pGVar3);
        if (iVar1 == 0) {
          uVar8 = uVar8 | 0x4000000040000000;
        }
        else {
          uVar8 = (uVar8 & 0xbfffffffbfffffff) + 0x4000000000000000;
        }
      }
      else {
        uVar8 = uVar8 & 0xbfffffffbfffffff | 0x40000000;
      }
      *(ulong *)pGVar3 = uVar8;
      iVar9 = iVar9 + 1;
    }
    if (fVerbose != 0) {
      iVar9 = 0;
      while ((iVar9 < p->vCos->nSize - p->nRegs &&
             (pGVar3 = Gia_ManCo(p,iVar9), pGVar3 != (Gia_Obj_t *)0x0))) {
        uVar8 = *(ulong *)pGVar3;
        iVar1 = 0x30;
        if ((uVar8 & 0x4000000040000000) == 0x40000000) {
LAB_00217aa2:
          putchar(iVar1);
        }
        else {
          iVar1 = 0x31;
          if ((((uVar8 >> 0x3e & 1) == 0 | (byte)(uVar8 >> 0x1e) & 1) != 1) ||
             (iVar1 = 0x58, (((uint)uVar8 & (uint)(uVar8 >> 0x20)) >> 0x1e & 1) == 1))
          goto LAB_00217aa2;
        }
        iVar9 = iVar9 + 1;
      }
      putchar(10);
    }
    iVar9 = 0;
    while ((iVar9 < p->vCos->nSize - p->nRegs &&
           (pGVar3 = Gia_ManCo(p,iVar9), pGVar3 != (Gia_Obj_t *)0x0))) {
      iVar1 = Vec_IntEntry(p_00,iVar9);
      if ((iVar1 == nFrames) && ((~*(ulong *)pGVar3 & 0x4000000040000000) == 0)) {
        Vec_IntWriteEntry(p_00,iVar9,Entry);
        local_58 = local_58 + -1;
      }
      iVar9 = iVar9 + 1;
    }
    if (local_58 == 0) {
      iVar7 = Entry;
      if (fVerbose == 0) {
        return p_00;
      }
      goto LAB_00217b49;
    }
    Entry = Entry + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManPoXSim( Gia_Man_t * p, int nFrames, int fVerbose )
{
    Vec_Int_t * vRes;
    Gia_Obj_t * pObj;
    int f, k, nLeft = Gia_ManPoNum(p);
    vRes = Vec_IntAlloc( Gia_ManPoNum(p) );
    Vec_IntFill( vRes, Gia_ManPoNum(p), nFrames );
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            Gia_ObjTerSimSetX( pObj );
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
        if ( fVerbose )
        {
            Gia_ManForEachPo( p, pObj, k )
                Gia_ObjTerSimPrint( pObj );
            printf( "\n" );
        }
        Gia_ManForEachPo( p, pObj, k )
            if ( Vec_IntEntry(vRes, k) == nFrames && Gia_ObjTerSimGetX(pObj) )
                Vec_IntWriteEntry(vRes, k, f), nLeft--;
        if ( nLeft == 0 )
            break;
    }
    if ( fVerbose )
    {
        if ( nLeft == 0 )
            printf( "Simulation converged after %d frames.\n", f+1 );
        else
            printf( "Simulation terminated after %d frames.\n", nFrames );
    }        
//    Vec_IntPrint( vRes );
    return vRes;
}